

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

statement_base * __thiscall
cs::method_if::translate
          (method_if *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  ulong uVar1;
  element_type *peVar2;
  value_type ptVar3;
  token_base *ptVar4;
  _Elt_pointer pdVar5;
  bool bVar6;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *pdVar7;
  _Elt_pointer ppsVar8;
  int iVar9;
  const_reference pptVar10;
  token_base **pptVar11;
  _Elt_pointer pdVar12;
  bool *pbVar13;
  statement_ifelse *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Elt_pointer pptVar14;
  compile_error *this_01;
  long lVar15;
  iterator *piVar16;
  ulong uVar17;
  statement_base **ppsVar18;
  statement_base **ptr;
  statement_base **__args;
  size_t size;
  statement_base **ppsVar19;
  long lVar20;
  deque<cs::statement_base*,std::allocator<cs::statement_base*>> *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_03;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *p_Var21;
  bool bVar22;
  _Map_pointer pppsVar23;
  _Self __tmp;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body_true;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body_false;
  tree_type<cs::token_base_*> local_3c0;
  tree_type<cs::token_base_*> local_3b8;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *local_3b0;
  context_t local_3a8;
  context_t local_398;
  context_t local_388;
  context_t local_378;
  context_t local_368;
  value_type local_358;
  token_base *local_350;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_348;
  undefined1 local_328 [16];
  tree_node local_318;
  iterator local_2f8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_2d8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_288;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_238;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_1e8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_198;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_148;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_f8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_a8;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_58;
  
  local_2d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (statement_base **)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_start._M_last = (statement_base **)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur = (statement_base **)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_2d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
            (&local_2d8,0);
  peVar2 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_348._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_348._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_first;
  local_348._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_348._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar20 = (long)local_348._M_cur - (long)local_348._M_first;
  lVar15 = lVar20 >> 4;
  uVar1 = lVar15 * -0x3333333333333333 + 1;
  if (uVar1 < 6) {
    local_348._M_cur = local_348._M_cur + 1;
  }
  else {
    if (lVar20 < -0x4f) {
      uVar17 = ~((lVar15 * 0x3333333333333333 - 2U) / 6);
    }
    else {
      uVar17 = uVar1 / 6;
    }
    local_348._M_node = local_348._M_node + uVar17;
    local_348._M_first = *local_348._M_node;
    local_348._M_last = local_348._M_first + 6;
    local_348._M_cur = local_348._M_first + uVar17 * -6 + uVar1;
  }
  local_58._M_cur =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58._M_first =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58._M_last =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58._M_node =
       (raw->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
              *)local_328,&local_348,&local_58,(allocator_type *)&local_288);
  translator_type::translate
            (&peVar2->translator,&peVar2->context,
             (deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)local_328,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_2d8,false)
  ;
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)local_328);
  ppsVar8 = local_2d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur ==
      local_2d8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    bVar22 = false;
  }
  else {
    pppsVar23 = local_2d8._M_impl.super__Deque_impl_data._M_start._M_node;
    ppsVar19 = local_2d8._M_impl.super__Deque_impl_data._M_start._M_last;
    ppsVar18 = local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur;
    bVar6 = false;
    do {
      iVar9 = (*(*ppsVar18)->_vptr_statement_base[2])();
      bVar22 = bVar6;
      if ((iVar9 == 0xb) && (bVar22 = true, bVar6)) {
        this_01 = (compile_error *)__cxa_allocate_exception(0x28);
        local_328._0_8_ = &local_318;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_328,"Multi Else Grammar.","");
        compile_error::compile_error(this_01,(string *)local_328);
        __cxa_throw(this_01,&compile_error::typeinfo,compile_error::~compile_error);
      }
      ppsVar18 = ppsVar18 + 1;
      if (ppsVar18 == ppsVar19) {
        ppsVar18 = pppsVar23[1];
        pppsVar23 = pppsVar23 + 1;
        ppsVar19 = ppsVar18 + 0x40;
      }
      bVar6 = bVar22;
    } while (ppsVar18 != ppsVar8);
  }
  size = 1;
  pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                       ((raw->
                        super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                        )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar3 = *pptVar10;
  local_328._0_8_ = ptVar3[1]._vptr_token_base;
  pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_328);
  ptVar4 = *pptVar11;
  if (bVar22) {
    local_2f8._M_last = (_Elt_pointer)0x0;
    local_2f8._M_node = (_Map_pointer)0x0;
    local_2f8._M_cur = (_Elt_pointer)0x0;
    local_2f8._M_first = (_Elt_pointer)0x0;
    local_318.right = (tree_node *)0x0;
    local_318.data = (token_base *)0x0;
    local_318.root = (tree_node *)0x0;
    local_318.left = (tree_node *)0x0;
    local_328._0_8_ = (tree_node *)0x0;
    local_328._8_8_ = 0;
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
              ((_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)local_328
               ,0);
    local_288._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_288._M_impl.super__Deque_impl_data._M_map_size = 0;
    ppsVar19 = (statement_base **)0x0;
    local_3b0 = raw;
    local_358 = ptVar3;
    local_350 = ptVar4;
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
              (&local_288,0);
    ppsVar8 = local_2d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur !=
        local_2d8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      bVar22 = true;
      ppsVar18 = local_2d8._M_impl.super__Deque_impl_data._M_start._M_last;
      __args = local_2d8._M_impl.super__Deque_impl_data._M_start._M_cur;
      pppsVar23 = local_2d8._M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        iVar9 = (*(*__args)->_vptr_statement_base[2])();
        if (iVar9 == 0xb) {
          bVar22 = false;
        }
        else {
          if (bVar22) {
            piVar16 = &local_2f8;
            pdVar12 = (_Elt_pointer)local_2f8._M_cur;
            this_02 = (deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)local_328;
            pdVar5 = (_Elt_pointer)local_2f8._M_last;
          }
          else {
            piVar16 = &local_288._M_impl.super__Deque_impl_data._M_finish;
            pdVar12 = (_Elt_pointer)local_288._M_impl.super__Deque_impl_data._M_finish._M_cur;
            this_02 = (deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)&local_288;
            pdVar5 = (_Elt_pointer)local_288._M_impl.super__Deque_impl_data._M_finish._M_last;
          }
          if (pdVar12 ==
              (_Elt_pointer)
              &pdVar5[-1].super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node) {
            ppsVar19 = __args;
            std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
            _M_push_back_aux<cs::statement_base*const&>(this_02,__args);
          }
          else {
            (pdVar12->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
            _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)*__args;
            piVar16->_M_cur = piVar16->_M_cur + 1;
          }
        }
        __args = __args + 1;
        if (__args == ppsVar18) {
          __args = pppsVar23[1];
          pppsVar23 = pppsVar23 + 1;
          ppsVar18 = __args + 0x40;
        }
      } while (__args != ppsVar8);
    }
    ptVar4 = local_350;
    if ((local_350 == (token_base *)0x0) ||
       (iVar9 = (*local_350->_vptr_token_base[2])(local_350), iVar9 != 7)) {
      this_00 = (statement_ifelse *)
                statement_base::operator_new((statement_base *)0xc8,(size_t)ppsVar19);
      pdVar7 = local_3b0;
      iVar9 = tree_type<cs::token_base_*>::copy
                        ((EVP_PKEY_CTX *)local_358[1]._vptr_token_base,(EVP_PKEY_CTX *)0x0);
      local_3b8.mRoot = (tree_node *)CONCAT44(extraout_var_00,iVar9);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_148,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)local_328);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_198,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_288);
      local_388.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_388.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_388.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_388.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_388.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_388.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_388.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      pdVar5 = (pdVar7->
               super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptVar14 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pptVar14 ==
          (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pptVar14 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      statement_ifelse::statement_ifelse
                (this_00,&local_3b8,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_148,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_198,
                 &local_388,pptVar14[-1]);
      if (local_388.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_388.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_198);
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_148);
      tree_type<cs::token_base_*>::destroy(local_3b8.mRoot);
    }
    else {
      pbVar13 = cs_impl::any::const_val<bool>((any *)(ptVar4 + 1));
      pdVar7 = local_3b0;
      if (*pbVar13 == true) {
        this_00 = (statement_ifelse *)
                  statement_base::operator_new((statement_base *)0x70,(size_t)ppsVar19);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_a8,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)local_328);
        local_368.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_368.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
        if (local_368.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_368.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_368.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_368.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_368.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        pdVar5 = (pdVar7->
                 super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptVar14 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar14 ==
            (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_first) {
          pptVar14 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                     )._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        p_Var21 = &local_a8;
        statement_block::statement_block
                  ((statement_block *)this_00,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)p_Var21,
                   &local_368,pptVar14[-1]);
        this_03._M_pi =
             local_368.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
      }
      else {
        this_00 = (statement_ifelse *)
                  statement_base::operator_new((statement_base *)0x70,(size_t)ppsVar19);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_f8,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_288)
        ;
        local_378.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_378.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
        if (local_378.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_378.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_378.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_378.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_378.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        pdVar5 = (pdVar7->
                 super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_cur;
        pptVar14 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar14 ==
            (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_first) {
          pptVar14 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                     )._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        p_Var21 = &local_f8;
        statement_block::statement_block
                  ((statement_block *)this_00,
                   (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)p_Var21,
                   &local_378,pptVar14[-1]);
        this_03._M_pi =
             local_378.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
      }
      if (this_03._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03._M_pi);
      }
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (p_Var21);
    }
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
              (&local_288);
    p_Var21 = (_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)local_328;
  }
  else {
    if ((ptVar4 == (token_base *)0x0) ||
       (iVar9 = (*ptVar4->_vptr_token_base[2])(ptVar4), iVar9 != 7)) {
      this_00 = (statement_ifelse *)statement_base::operator_new((statement_base *)0x78,size);
      iVar9 = tree_type<cs::token_base_*>::copy
                        ((EVP_PKEY_CTX *)ptVar3[1]._vptr_token_base,(EVP_PKEY_CTX *)0x0);
      local_3c0.mRoot = (tree_node *)CONCAT44(extraout_var,iVar9);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_238,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_2d8);
      local_3a8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_3a8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_3a8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_3a8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_3a8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_3a8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_3a8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      pdVar5 = (raw->
               super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptVar14 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pptVar14 ==
          (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pptVar14 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                   _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      statement_if::statement_if
                ((statement_if *)this_00,&local_3c0,
                 (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_238,
                 &local_3a8,pptVar14[-1]);
      if (local_3a8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3a8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                (&local_238);
      tree_type<cs::token_base_*>::destroy(local_3c0.mRoot);
      goto LAB_0015bb0a;
    }
    pbVar13 = cs_impl::any::const_val<bool>((any *)(ptVar4 + 1));
    if (*pbVar13 != true) {
      this_00 = (statement_ifelse *)0x0;
      goto LAB_0015bb0a;
    }
    this_00 = (statement_ifelse *)statement_base::operator_new((statement_base *)0x70,size);
    std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_1e8,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_2d8);
    local_398.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_398.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_398.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_398.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_398.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_398.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_398.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
      }
    }
    pdVar5 = (raw->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar14 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar14 ==
        (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar14 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    statement_block::statement_block
              ((statement_block *)this_00,
               (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_1e8,
               &local_398,pptVar14[-1]);
    if (local_398.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_398.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    p_Var21 = &local_1e8;
  }
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (p_Var21);
LAB_0015bb0a:
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&local_2d8);
  return &this_00->super_statement_base;
}

Assistant:

statement_base *method_if::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		bool have_else = false;
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		for (auto &ptr: body) {
			if (ptr->get_type() == statement_types::else_) {
				if (!have_else)
					have_else = true;
				else
					throw compile_error("Multi Else Grammar.");
			}
		}
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		token_base *ptr = tree.root().data();
		if (have_else) {
			std::deque<statement_base *> body_true;
			std::deque<statement_base *> body_false;
			bool now_place = true;
			for (auto &ptr: body) {
				if (ptr->get_type() == statement_types::else_) {
					now_place = false;
					continue;
				}
				if (now_place)
					body_true.push_back(ptr);
				else
					body_false.push_back(ptr);
			}
			if (ptr != nullptr && ptr->get_type() == token_types::value) {
				if (static_cast<token_value *>(ptr)->get_value().const_val<bool>())
					return new statement_block(body_true, context, raw.front().back());
				else
					return new statement_block(body_false, context, raw.front().back());
			}
			else
				return new statement_ifelse(tree, body_true, body_false, context, raw.front().back());
		}
		else if (ptr != nullptr && ptr->get_type() == token_types::value) {
			if (static_cast<token_value *>(ptr)->get_value().const_val<bool>())
				return new statement_block(body, context, raw.front().back());
			else
				return nullptr;
		}
		else
			return new statement_if(tree, body, context, raw.front().back());
	}